

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

FILE * open_input(char *filename)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  FILE *pFVar5;
  long lVar6;
  int iVar7;
  FILE *local_40;
  
  sVar4 = strlen(filename);
  iVar7 = (int)sVar4;
  lVar6 = 0;
  while( true ) {
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_24787_0025cd80 + lVar6);
    sVar4 = strlen(pcVar1);
    bVar2 = true;
    if ((int)sVar4 < iVar7) {
      iVar3 = strcmp(filename + ((long)iVar7 - (long)(int)sVar4),pcVar1);
      if (iVar3 == 0) {
        pcVar1 = *(char **)((long)&DAT_0025cd88 + lVar6);
        sVar4 = strlen(pcVar1);
        __dest = (char *)malloc(sVar4 + (long)iVar7 + 2);
        strcpy(__dest,pcVar1);
        sVar4 = strlen(__dest);
        (__dest + sVar4)[0] = ' ';
        (__dest + sVar4)[1] = '\0';
        strcat(__dest,filename);
        local_40 = popen(__dest,"r");
        free(__dest);
        bVar2 = false;
      }
    }
    if (!bVar2) break;
    lVar6 = lVar6 + 0x10;
    if (lVar6 == 0x40) {
      pFVar5 = fopen(filename,"r");
      return (FILE *)pFVar5;
    }
  }
  return (FILE *)local_40;
}

Assistant:

FILE *open_input(const char *filename) {
	const char * const tab[][2] = {
		{ ".gz", "zcat" },
		{ ".Z", "zcat" },
		{ ".bz2", "bzcat" },
		{ ".xz", "xzcat" },
	};
	int i;
	int flen = strlen(filename);
	for (i = 0; i < sizeof tab / sizeof tab[0]; i++) {
		int elen = strlen(tab[i][0]);
		if (flen > elen && !strcmp(filename + flen - elen, tab[i][0])) {
			char *cmd = malloc(flen + strlen(tab[i][1]) + 2);
			FILE *res;
			strcpy(cmd, tab[i][1]);
			strcat(cmd, " ");
			strcat(cmd, filename);
			res = popen(cmd, "r");
			free(cmd);
			return res;
		}
	}
	return fopen(filename, "r");
}